

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O2

int yaml_parser_update_raw_buffer(yaml_parser_t *parser)

{
  uchar **ppuVar1;
  uchar *puVar2;
  int iVar3;
  uchar *puVar4;
  int iVar5;
  uchar *__dest;
  size_t size_read;
  
  size_read = 0;
  __dest = (parser->raw_buffer).start;
  puVar4 = (parser->raw_buffer).pointer;
  iVar5 = 1;
  if (((__dest != puVar4) || ((parser->raw_buffer).last != (parser->raw_buffer).end)) &&
     (parser->eof == 0)) {
    if ((__dest < puVar4) && (puVar2 = (parser->raw_buffer).last, puVar4 < puVar2)) {
      memmove(__dest,puVar4,(long)puVar2 - (long)puVar4);
      __dest = (parser->raw_buffer).start;
      puVar4 = (parser->raw_buffer).pointer;
    }
    puVar4 = (parser->raw_buffer).last + ((long)__dest - (long)puVar4);
    (parser->raw_buffer).last = puVar4;
    (parser->raw_buffer).pointer = __dest;
    iVar3 = (*parser->read_handler)
                      (parser->read_handler_data,puVar4,
                       (long)(parser->raw_buffer).end - (long)puVar4,&size_read);
    if (iVar3 == 0) {
      parser->error = YAML_READER_ERROR;
      parser->problem = "input error";
      parser->problem_offset = parser->offset;
      parser->problem_value = -1;
      iVar5 = 0;
    }
    else {
      ppuVar1 = &(parser->raw_buffer).last;
      *ppuVar1 = *ppuVar1 + size_read;
      if (size_read == 0) {
        parser->eof = 1;
      }
    }
  }
  return iVar5;
}

Assistant:

static int
yaml_parser_update_raw_buffer(yaml_parser_t *parser)
{
    size_t size_read = 0;

    /* Return if the raw buffer is full. */

    if (parser->raw_buffer.start == parser->raw_buffer.pointer
            && parser->raw_buffer.last == parser->raw_buffer.end)
        return 1;

    /* Return on EOF. */

    if (parser->eof) return 1;

    /* Move the remaining bytes in the raw buffer to the beginning. */

    if (parser->raw_buffer.start < parser->raw_buffer.pointer
            && parser->raw_buffer.pointer < parser->raw_buffer.last) {
        memmove(parser->raw_buffer.start, parser->raw_buffer.pointer,
                parser->raw_buffer.last - parser->raw_buffer.pointer);
    }
    parser->raw_buffer.last -=
        parser->raw_buffer.pointer - parser->raw_buffer.start;
    parser->raw_buffer.pointer = parser->raw_buffer.start;

    /* Call the read handler to fill the buffer. */

    if (!parser->read_handler(parser->read_handler_data, parser->raw_buffer.last,
                parser->raw_buffer.end - parser->raw_buffer.last, &size_read)) {
        return yaml_parser_set_reader_error(parser, "input error",
                parser->offset, -1);
    }
    parser->raw_buffer.last += size_read;
    if (!size_read) {
        parser->eof = 1;
    }

    return 1;
}